

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaQProp.cpp
# Opt level: O2

void __thiscall NaQuickProp::UpdateNN(NaQuickProp *this)

{
  UpdateNN((NaQuickProp *)((long)&this->_vptr_NaQuickProp + (long)this->_vptr_NaQuickProp[-8]));
  return;
}

Assistant:

void    NaQuickProp::UpdateNN ()
{
    NaStdBackProp::UpdateNN();

    unsigned    iInput, /*iNeuron,*/ iLayer;

    // Store Xinp from previous step
    NaPrintLog("NaQuickProp::UpdateNN():\n");
    for(iLayer = nd.InputLayer(); iLayer <= nd.OutputLayer(); ++iLayer){
        for(iInput = 0; iInput < nd.Inputs(iLayer); ++iInput){
            Xinp_prev[iLayer][iInput] = nn().Xinp(iLayer)[iInput];
	    NaPrintLog("             %u:%u =%g\n",
		       iLayer, iInput, Xinp_prev[iLayer][iInput]);
        }
    }
}